

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer-test.cc
# Opt level: O0

void Buffer_add_reference_callback_reached_in_buffer_dtor_Test::TestBody::anon_class_1_0_00000001::
     __invoke(void *data,size_t len,void *vdata)

{
  anon_class_1_0_00000001 local_21;
  void *local_20;
  void *vdata_local;
  size_t len_local;
  void *data_local;
  
  local_20 = vdata;
  vdata_local = (void *)len;
  len_local = (size_t)data;
  operator()(&local_21,data,len,vdata);
  return;
}

Assistant:

TEST(Buffer, add_reference_callback_reached_in_buffer_dtor) {
    auto cb = [](void* data, size_t len, void* vdata) {
        auto* iop = reinterpret_cast<bfy_iovec*>(vdata);
        iop->iov_base = data;
        iop->iov_len = len;
    };

    // setup: add the reference to the buffer
    auto buf = bfy_buffer_init();
    auto constexpr str = std::string_view { "Lorem ipsum dolor sit amet" };
    auto io = bfy_iovec {};
    EXPECT_EQ(0, bfy_buffer_add_reference(&buf, std::data(str), std::size(str), cb, &io));

    // confirm that the callback was invoked in the destructor
    bfy_buffer_destruct(&buf);
    EXPECT_EQ(std::data(str), io.iov_base);
    EXPECT_EQ(std::size(str), io.iov_len);
}